

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triple.cpp
# Opt level: O2

Triple * __thiscall
llvm::Triple::getLittleEndianArchVariant(Triple *__return_storage_ptr__,Triple *this)

{
  ArchType Kind;
  
  Triple(__return_storage_ptr__,this);
  switch(this->Arch) {
  case UnknownArch:
  case armeb:
  case ppc:
  case sparcv9:
  case systemz:
  case thumbeb:
  case lanai:
    Kind = UnknownArch;
    break;
  case arm:
  case aarch64:
  case avr:
  case bpfel:
  case hexagon:
  case mipsel:
  case mips64el:
  case msp430:
  case nios2:
  case ppc64le:
  case r600:
  case amdgcn:
  case riscv32:
  case riscv64:
  case sparcel:
  case tcele:
  case thumb:
  case x86:
  case x86_64:
  case xcore:
  case nvptx:
  case nvptx64:
  case le32:
  case le64:
  case amdil:
  case amdil64:
  case hsail:
  case hsail64:
  case spir:
  case spir64:
  case kalimba:
  case shave:
  case wasm32:
  case wasm64:
  case renderscript32:
  case LastArchType:
    goto switchD_0012eafb_caseD_1;
  case aarch64_be:
    Kind = aarch64;
    break;
  default:
    llvm_unreachable_internal
              ("getLittleEndianArchVariant: unknown triple.",
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/Triple.cpp"
               ,0x5bb);
  case bpfeb:
    Kind = bpfel;
    break;
  case mips:
    Kind = mipsel;
    break;
  case mips64:
    Kind = mips64el;
    break;
  case ppc64:
    Kind = ppc64le;
    break;
  case sparc:
    Kind = sparcel;
    break;
  case tce:
    Kind = tcele;
  }
  setArch(__return_storage_ptr__,Kind);
switchD_0012eafb_caseD_1:
  return __return_storage_ptr__;
}

Assistant:

Triple Triple::getLittleEndianArchVariant() const {
  Triple T(*this);
  if (isLittleEndian())
    return T;

  switch (getArch()) {
  case Triple::UnknownArch:
  case Triple::lanai:
  case Triple::ppc:
  case Triple::sparcv9:
  case Triple::systemz:

  // ARM is intentionally unsupported here, changing the architecture would
  // drop any arch suffixes.
  case Triple::armeb:
  case Triple::thumbeb:
    T.setArch(UnknownArch);
    break;

  case Triple::tce:        T.setArch(Triple::tcele);    break;
  case Triple::aarch64_be: T.setArch(Triple::aarch64);  break;
  case Triple::bpfeb:      T.setArch(Triple::bpfel);    break;
  case Triple::mips64:     T.setArch(Triple::mips64el); break;
  case Triple::mips:       T.setArch(Triple::mipsel);   break;
  case Triple::ppc64:      T.setArch(Triple::ppc64le);  break;
  case Triple::sparc:      T.setArch(Triple::sparcel);  break;
  default:
    llvm_unreachable("getLittleEndianArchVariant: unknown triple.");
  }
  return T;
}